

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O2

void __thiscall
duckdb::LateMaterialization::LateMaterialization(LateMaterialization *this,Optimizer *optimizer)

{
  ClientConfig *pCVar1;
  
  (this->super_BaseColumnPruner).column_references._M_h._M_buckets =
       &(this->super_BaseColumnPruner).column_references._M_h._M_single_bucket;
  (this->super_BaseColumnPruner).column_references._M_h._M_bucket_count = 1;
  (this->super_BaseColumnPruner).column_references._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_BaseColumnPruner).column_references._M_h._M_element_count = 0;
  (this->super_BaseColumnPruner).column_references._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_BaseColumnPruner).column_references._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_BaseColumnPruner).column_references._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__LateMaterialization_0278ca30;
  this->optimizer = optimizer;
  LogicalType::LogicalType(&this->row_id_type);
  pCVar1 = ClientConfig::GetConfig(optimizer->context);
  this->max_row_count = pCVar1->late_materialization_max_rows;
  return;
}

Assistant:

LateMaterialization::LateMaterialization(Optimizer &optimizer) : optimizer(optimizer) {
	max_row_count = ClientConfig::GetConfig(optimizer.context).late_materialization_max_rows;
}